

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigFeed.c
# Opt level: O0

int Fraig_ManSimulateBitNode(Fraig_Man_t *p,Fraig_Node_t *pNode,int *pModel)

{
  Fraig_Node_t *pFVar1;
  uint uVar2;
  int local_2c;
  int i;
  int RetValue;
  int fCompl;
  int *pModel_local;
  Fraig_Node_t *pNode_local;
  Fraig_Man_t *p_local;
  
  Fraig_ManIncrementTravId(p);
  for (local_2c = 0; local_2c < p->vInputs->nSize; local_2c = local_2c + 1) {
    Fraig_NodeSetTravIdCurrent(p,p->vInputs->pArray[local_2c]);
    pFVar1 = p->vInputs->pArray[local_2c];
    *(uint *)&pFVar1->field_0x18 =
         *(uint *)&pFVar1->field_0x18 & 0xffffffbf | (pModel[local_2c] & 1U) << 6;
  }
  uVar2 = Fraig_ManSimulateBitNode_rec(p,(Fraig_Node_t *)((ulong)pNode & 0xfffffffffffffffe));
  return (uint)pNode & 1 ^ uVar2;
}

Assistant:

int Fraig_ManSimulateBitNode( Fraig_Man_t * p, Fraig_Node_t * pNode, int * pModel )
{
    int fCompl, RetValue, i;
    // set the PI values
    Fraig_ManIncrementTravId( p );
    for ( i = 0; i < p->vInputs->nSize; i++ )
    {
        Fraig_NodeSetTravIdCurrent( p, p->vInputs->pArray[i] );
        p->vInputs->pArray[i]->fMark3 = pModel[i];
    }
    // perform the traversal
    fCompl = Fraig_IsComplement(pNode);
    RetValue = Fraig_ManSimulateBitNode_rec( p, Fraig_Regular(pNode) );
    return fCompl ^ RetValue;
}